

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::fit(CDT *this)

{
  double dVar1;
  uint uVar2;
  ostream *poVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  double dVar10;
  undefined1 auVar11 [16];
  Shape SVar12;
  uint local_1dc;
  value_type vStack_1d8;
  uint i_6;
  double output;
  double end;
  double beg;
  vector<Interval,_std::allocator<Interval>_> intervals;
  uint i_5;
  uint i_4;
  double key_bias;
  uint uStack_184;
  uint local_17c;
  uint i_3;
  uint local_168;
  uint local_15c;
  uint i_2;
  uint uStack_144;
  uint col;
  double tmp;
  uint local_120;
  uint local_114;
  uint j;
  uint local_100;
  uint local_f4;
  uint t;
  double *weight;
  uint uStack_d4;
  uint local_cc;
  value_type_conflict1 vStack_c8;
  uint i_1;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  uint local_a4;
  undefined1 local_a0 [4];
  uint i;
  vector<double,_std::allocator<double>_> keys;
  undefined1 local_78 [8];
  Matrix<double> mat;
  double bias;
  CDT *this_local;
  
  mat.m_functions[6] = (_func_void_Matrix<double>_ptr_void_ptr *)(this->m_info).bias;
  DataSet::matrix((Matrix<double> *)local_78,&this->m_dataset);
  poVar3 = std::operator<<((ostream *)&std::cout,"Dataset bias: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)mat.m_functions[6]);
  std::operator<<(poVar3,'\n');
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a0);
  local_a4 = 0;
  while( true ) {
    uVar2 = local_a4;
    SVar12 = Matrix<double>::shape(&this->m_input);
    local_c0 = SVar12._0_8_;
    local_b8 = SVar12.is_diogonal;
    local_b0._0_4_ = SVar12.n_row;
    local_b0 = local_c0;
    local_a8 = local_b8;
    if ((uint)local_b0 <= uVar2) break;
    vStack_c8 = 0.0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_a0,&stack0xffffffffffffff38);
    local_a4 = local_a4 + 1;
  }
  pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
  pvVar5 = Matrix<double>::operator[](&pvVar4->m_weights,0);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,0);
  *pvVar6 = 1.0;
  local_cc = 0;
  while( true ) {
    SVar12 = Matrix<double>::shape(&this->m_input);
    uStack_d4 = SVar12.n_col;
    if (uStack_d4 - 1 <= local_cc) break;
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    pvVar5 = Matrix<double>::operator[](&pvVar4->m_weights,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)(local_cc + 1));
    local_f4 = 0;
    while( true ) {
      SVar12 = Matrix<double>::shape(&this->m_input);
      local_100 = SVar12.n_row;
      if (local_100 <= local_f4) break;
      pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
      pvVar5 = Matrix<double>::operator[](&pvVar4->m_weights,0);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_cc);
      dVar10 = *pvVar7;
      pvVar5 = Matrix<double>::operator[](&this->m_input,local_f4);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_cc);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,(ulong)local_f4);
      *pvVar7 = dVar10 * dVar1 + *pvVar7;
      local_f4 = local_f4 + 1;
    }
    local_114 = 0;
    while( true ) {
      SVar12 = Matrix<double>::shape(&this->m_input);
      local_120 = SVar12.n_row;
      if (local_120 - 1 <= local_114) break;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,(ulong)local_114);
      dVar10 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,(ulong)(local_114 + 1)
                         );
      if (dVar10 < *pvVar7) {
        pvVar5 = Matrix<double>::operator[](&this->m_input,local_114);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar5,(ulong)(local_cc + 1));
        dVar10 = *pvVar7;
        pvVar5 = Matrix<double>::operator[](&this->m_input,local_114 + 1);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar5,(ulong)(local_cc + 1));
        if (*pvVar7 <= dVar10 && dVar10 != *pvVar7) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_a0,
                              (ulong)(local_114 + 1));
          dVar10 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_a0,(ulong)local_114);
          dVar1 = *pvVar7;
          pvVar5 = Matrix<double>::operator[](&this->m_input,local_114);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar5,(ulong)(local_cc + 1));
          dVar10 = (dVar10 - dVar1) / *pvVar7;
          if (dVar10 < *pvVar6) {
            *pvVar6 = dVar10;
          }
        }
      }
      local_114 = local_114 + 1;
    }
    local_cc = local_cc + 1;
  }
  SVar12 = Matrix<double>::shape(&this->m_input);
  uStack_144 = SVar12.n_col;
  local_15c = 0;
  while( true ) {
    SVar12 = Matrix<double>::shape(&this->m_input);
    local_168 = SVar12.n_row;
    if (local_168 <= local_15c) break;
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    pvVar5 = Matrix<double>::operator[](&pvVar4->m_weights,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar5,(ulong)(uStack_144 - 1));
    dVar10 = *pvVar6;
    pvVar5 = Matrix<double>::operator[](&this->m_input,local_15c);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar5,(ulong)(uStack_144 - 1));
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_a0,(ulong)local_15c);
    *pvVar6 = dVar10 * dVar1 + *pvVar6;
    local_15c = local_15c + 1;
  }
  std::operator<<((ostream *)&std::cout,"Updated weights: ");
  local_17c = 0;
  while( true ) {
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    SVar12 = Matrix<double>::shape(&pvVar4->m_weights);
    uStack_184 = SVar12.n_col;
    if (uStack_184 <= local_17c) break;
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    pvVar5 = Matrix<double>::operator[](&pvVar4->m_weights,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_17c);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar6);
    std::operator<<(poVar3,"\t");
    local_17c = local_17c + 1;
  }
  std::operator<<((ostream *)&std::cout,'\n');
  _i_5 = 0.0;
  intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar8 = (ulong)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    pvVar5 = Matrix<double>::operator[](&pvVar4->m_weights,0);
    sVar9 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
    if (sVar9 <= uVar8) break;
    pvVar4 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    pvVar5 = Matrix<double>::operator[](&pvVar4->m_weights,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar5,(ulong)intervals.
                                      super__Vector_base<Interval,_std::allocator<Interval>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    _i_5 = *pvVar6 * (double)mat.m_functions[6] + _i_5;
    intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  for (intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      uVar8 = (ulong)(uint)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
      sVar9 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_a0), uVar8 < sVar9;
      intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_a0,
                        (ulong)(uint)intervals.
                                     super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage);
    *pvVar6 = *pvVar6 - _i_5;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Key bias: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,_i_5);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout," > Initializing intervals...\n");
  std::vector<Interval,_std::allocator<Interval>_>::vector
            ((vector<Interval,_std::allocator<Interval>_> *)&beg);
  end = 0.0;
  pvVar5 = Matrix<double>::operator[](&this->m_output,0);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,0);
  vStack_1d8 = *pvVar6;
  for (local_1dc = 0;
      sVar9 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_a0), local_1dc < sVar9;
      local_1dc = local_1dc + 1) {
    pvVar5 = Matrix<double>::operator[](&this->m_output,local_1dc);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,0);
    if ((*pvVar6 != vStack_1d8) || (NAN(*pvVar6) || NAN(vStack_1d8))) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,
                          (long)end | (long)(end - 9.223372036854776e+18) & (long)end >> 0x3f);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,
                          (long)output |
                          (long)(output - 9.223372036854776e+18) & (long)output >> 0x3f);
      std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                ((vector<Interval,std::allocator<Interval>> *)&beg,pvVar6,pvVar7,
                 &stack0xfffffffffffffe28);
      output = output + 1.0;
      end = output;
      pvVar5 = Matrix<double>::operator[](&this->m_output,(uint)(long)output);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,0);
      vStack_1d8 = *pvVar6;
    }
    else {
      output = (double)local_1dc;
    }
    sVar9 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_a0);
    if ((ulong)local_1dc == sVar9 - 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,
                          (long)end | (long)(end - 9.223372036854776e+18) & (long)end >> 0x3f);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a0,
                          (long)output |
                          (long)(output - 9.223372036854776e+18) & (long)output >> 0x3f);
      std::vector<Interval,std::allocator<Interval>>::emplace_back<double&,double&,double&>
                ((vector<Interval,std::allocator<Interval>> *)&beg,pvVar6,pvVar7,
                 &stack0xfffffffffffffe28);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Overfit rate: ");
  sVar9 = std::vector<Interval,_std::allocator<Interval>_>::size
                    ((vector<Interval,_std::allocator<Interval>_> *)&beg);
  auVar11._8_4_ = (int)(sVar9 >> 0x20);
  auVar11._0_8_ = sVar9;
  auVar11._12_4_ = 0x45300000;
  SVar12 = DataSet::shape(&this->m_dataset);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,((auVar11._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)) /
                             (double)(SVar12._0_8_ & 0xffffffff));
  std::operator<<(poVar3,'\n');
  Activation::initialize(&this->m_function,(vector<Interval,_std::allocator<Interval>_> *)&beg);
  std::vector<Interval,_std::allocator<Interval>_>::~vector
            ((vector<Interval,_std::allocator<Interval>_> *)&beg);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a0);
  Matrix<double>::~Matrix((Matrix<double> *)local_78);
  return;
}

Assistant:

void CDT::fit(){
    double bias=m_info.bias;
    Matrix_d mat=m_dataset.matrix();
    std::cout<<"Dataset bias: "<<bias<<'\n';

    // std::cout<<"dc sort:\n"<<m_input<<'\n'<<m_output<<'\n';

    std::vector<double> keys;
    for(unsigned i=0;i<m_input.shape().n_row;++i)
        keys.push_back(0.);
    
    m_layers[0].m_weights[0][0]=1.;
    for(unsigned i=0;i<m_input.shape().n_col-1;++i){
        double& weight=m_layers[0].m_weights[0][i+1];
        for(unsigned t=0;t<m_input.shape().n_row;++t){
            keys[t]+=m_layers[0].m_weights[0][i]*m_input[t][i];
        }
        for(unsigned j=0;j<m_input.shape().n_row-1;++j){
            if(keys[j]<keys[j+1] &&
               m_input[j][i+1]>m_input[j+1][i+1]){
                   double tmp;
                   tmp=(keys[j+1]-keys[j])/m_input[j][i+1];
                   if(weight>tmp) weight=tmp;
               }
        }
    }
    unsigned col=m_input.shape().n_col;
    for(unsigned i=0;i<m_input.shape().n_row;++i){
        keys[i]+=m_layers[0].m_weights[0][col-1]*m_input[i][col-1];
    }

    std::cout<<"Updated weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<"\t";
    }   std::cout<<'\n';

    // Normalizing keys
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // } std::cout<<'\n';

    double key_bias=0.;
    for(unsigned i=0;i<m_layers[0].m_weights[0].size();++i){
        // std::cout<<" |> +"<<m_layers[0].m_weights[0][i]<<" * "<<bias<<'\n';
        key_bias+=m_layers[0].m_weights[0][i]*bias;
    }
    for(unsigned i=0;i<keys.size();++i){
        keys[i]-=key_bias;
    }
    
    std::cout<<"Key bias: "<<key_bias<<'\n';
    // std::cout<<"Keys: ";
    // for(unsigned i=0;i<keys.size();++i){
    //     std::cout<<keys[i]<<"\t";
    // }   std::cout<<'\n';

    std::cout<<" > Initializing intervals...\n";
    
    std::vector<Interval> intervals;
    double beg=0, end, output=m_output[0][0];
    for(unsigned i=0;i<keys.size();++i){
        if(m_output[i][0]==output){
            end=i;
        }
        else{
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
            
            beg=++end;
            output=m_output[beg][0];
        }

        if(i==keys.size()-1){
            // std::cout<<" dbg int: "<<keys[beg]<<", "<<keys[end]<<", "<<output<<'\n';
            intervals.emplace_back(keys[beg], keys[end], output);
        }
    }
    std::cout<<"Overfit rate: "<<intervals.size()/(double)m_dataset.shape().n_row<<'\n';
    m_function.initialize(intervals);
}